

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O2

void __thiscall
CoreML::NeuralNetworkShaper::NeuralNetworkShaper
          (NeuralNetworkShaper *this,ModelDescription *interface,
          RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *layers,
          bool useInputAndOutputConstraints)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  *__x;
  _Rb_tree_header *p_Var1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
  *this_00;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Type *pTVar5;
  mapped_type *pmVar6;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *this_01;
  Type *pTVar7;
  iterator iVar8;
  ImageFeatureType *pIVar9;
  ArrayFeatureType *pAVar10;
  size_t sVar11;
  int i;
  int iVar12;
  FeatureType *pFVar13;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  blobColorsCopy;
  
  iVar12 = (interface->input_).super_RepeatedPtrFieldBase.current_size_;
  this->numColors = iVar12;
  __x = &this->blobColors;
  p_Var1 = &(this->blobColors)._M_t._M_impl.super__Rb_tree_header;
  (this->blobColors)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->blobColors)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->blobColors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->blobColors)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->blobColors)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->blobShapes)._M_t._M_impl.super__Rb_tree_header;
  (this->blobShapes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->blobShapes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->blobShapes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->blobShapes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->blobShapes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_00 = &this->blobShapes;
  for (blobColorsCopy._M_t._M_impl._0_4_ = 0; (int)blobColorsCopy._M_t._M_impl._0_4_ < iVar12;
      blobColorsCopy._M_t._M_impl._0_4_ = blobColorsCopy._M_t._M_impl._0_4_ + 1) {
    pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                       (&(interface->input_).super_RepeatedPtrFieldBase,
                        blobColorsCopy._M_t._M_impl._0_4_);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
             ::operator[](this_00,(pTVar5->name_).ptr_);
    ShapeConstraint::setName(pmVar6,(pTVar5->name_).ptr_);
    this_01 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
              ::operator[](__x,(pTVar5->name_).ptr_);
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>(this_01,(int *)&blobColorsCopy);
    if (useInputAndOutputConstraints) {
      pFVar13 = pTVar5->type_;
      if (pFVar13 == (FeatureType *)0x0) {
        pFVar13 = (FeatureType *)&Specification::_FeatureType_default_instance_;
      }
      ShapeConstraint::updateConstraint(pmVar6,pFVar13);
    }
    iVar12 = (interface->input_).super_RepeatedPtrFieldBase.current_size_;
  }
  do {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
    ::_Rb_tree(&blobColorsCopy._M_t,&__x->_M_t);
    for (iVar12 = 0; iVar4 = (layers->super_RepeatedPtrFieldBase).current_size_, iVar12 < iVar4;
        iVar12 = iVar12 + 1) {
      pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                         (&layers->super_RepeatedPtrFieldBase,iVar12);
      PassColorsDown(this,pTVar7);
      ProcessLayer(this,pTVar7);
    }
    while (0 < iVar4) {
      iVar4 = iVar4 + -1;
      pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                         (&layers->super_RepeatedPtrFieldBase,iVar4);
      PassColorsUp(this,pTVar7);
      ProcessLayer(this,pTVar7);
    }
    bVar2 = AllShapesDone(this);
    bVar3 = std::operator==(&blobColorsCopy._M_t,&__x->_M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
    ::~_Rb_tree(&blobColorsCopy._M_t);
  } while (!bVar2 && !bVar3);
  if (useInputAndOutputConstraints) {
    for (iVar12 = 0; iVar12 < (interface->output_).super_RepeatedPtrFieldBase.current_size_;
        iVar12 = iVar12 + 1) {
      pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                         (&(interface->output_).super_RepeatedPtrFieldBase,iVar12);
      iVar4 = std::__cxx11::string::compare((string *)(pTVar5->name_).ptr_);
      if (iVar4 != 0) {
        iVar4 = std::__cxx11::string::compare((string *)(pTVar5->name_).ptr_);
        if (iVar4 != 0) {
          iVar8 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
                  ::find(&this_00->_M_t,(pTVar5->name_).ptr_);
          if ((_Rb_tree_header *)iVar8._M_node != p_Var1) {
            pmVar6 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
                     ::at(this_00,(pTVar5->name_).ptr_);
            pFVar13 = pTVar5->type_;
            if (pFVar13 == (FeatureType *)0x0) {
              pFVar13 = (FeatureType *)&Specification::_FeatureType_default_instance_;
            }
            if (pFVar13->_oneof_case_[0] == 4) {
              pIVar9 = Specification::FeatureType::imagetype(pFVar13);
              ShapeConstraint::setChannel(pmVar6,(ulong)(pIVar9->colorspace_ != 10) * 2 + 1);
              pFVar13 = pTVar5->type_;
              if (pFVar13 == (FeatureType *)0x0) {
                pFVar13 = (FeatureType *)&Specification::_FeatureType_default_instance_;
              }
              pIVar9 = Specification::FeatureType::imagetype(pFVar13);
              ShapeConstraint::setHeight(pmVar6,pIVar9->height_);
              pFVar13 = pTVar5->type_;
              if (pFVar13 == (FeatureType *)0x0) {
                pFVar13 = (FeatureType *)&Specification::_FeatureType_default_instance_;
              }
              pIVar9 = Specification::FeatureType::imagetype(pFVar13);
              sVar11 = pIVar9->width_;
            }
            else {
              pAVar10 = Specification::FeatureType::multiarraytype(pFVar13);
              pFVar13 = pTVar5->type_;
              if (pFVar13 == (FeatureType *)0x0) {
                pFVar13 = (FeatureType *)&Specification::_FeatureType_default_instance_;
              }
              if ((pAVar10->shape_).current_size_ == 3) {
                pAVar10 = Specification::FeatureType::multiarraytype(pFVar13);
                sVar11 = Specification::ArrayFeatureType::shape(pAVar10,0);
                ShapeConstraint::setChannel(pmVar6,sVar11);
                pFVar13 = pTVar5->type_;
                if (pFVar13 == (FeatureType *)0x0) {
                  pFVar13 = (FeatureType *)&Specification::_FeatureType_default_instance_;
                }
                pAVar10 = Specification::FeatureType::multiarraytype(pFVar13);
                sVar11 = Specification::ArrayFeatureType::shape(pAVar10,1);
                ShapeConstraint::setHeight(pmVar6,sVar11);
                pFVar13 = pTVar5->type_;
                if (pFVar13 == (FeatureType *)0x0) {
                  pFVar13 = (FeatureType *)&Specification::_FeatureType_default_instance_;
                }
                pAVar10 = Specification::FeatureType::multiarraytype(pFVar13);
                sVar11 = Specification::ArrayFeatureType::shape(pAVar10,2);
              }
              else {
                pAVar10 = Specification::FeatureType::multiarraytype(pFVar13);
                if ((pAVar10->shape_).current_size_ != 1) goto LAB_005a9a39;
                pFVar13 = pTVar5->type_;
                if (pFVar13 == (FeatureType *)0x0) {
                  pFVar13 = (FeatureType *)&Specification::_FeatureType_default_instance_;
                }
                pAVar10 = Specification::FeatureType::multiarraytype(pFVar13);
                sVar11 = Specification::ArrayFeatureType::shape(pAVar10,0);
                ShapeConstraint::setChannel(pmVar6,sVar11);
                sVar11 = 1;
                ShapeConstraint::setHeight(pmVar6,1);
              }
            }
            ShapeConstraint::setWidth(pmVar6,sVar11);
          }
        }
      }
LAB_005a9a39:
    }
  }
  return;
}

Assistant:

NeuralNetworkShaper::NeuralNetworkShaper(const Specification::ModelDescription& interface, const google::protobuf::RepeatedPtrField<Specification::NeuralNetworkLayer>& layers, bool useInputAndOutputConstraints)
    :
    numColors(interface.input().size())
{

    for (int i = 0; i < interface.input().size(); i++) {
        const Specification::FeatureDescription& desc = interface.input(i);

        ShapeConstraint& constraint = blobShapes[desc.name()];
        constraint.setName(desc.name());
        // Each input blob starts as it's own color
        blobColors[desc.name()].insert(i);

        if (useInputAndOutputConstraints) {
            constraint.updateConstraint(desc.type());
        }

    }

    bool done = false;

    while (!done) {

        std::map<std::string, std::set<int> > blobColorsCopy = blobColors;

#if COREML_VALIDATOR_VERBOSE
        std::cout << std::endl << "=====================" << std::endl << "Computing neural network shapes" << std::endl  << "=====================" << std::endl;
        std::cout << std::endl << "Starting forward computation of neural network shapes" << std::endl << std::endl;
#endif

        // forward pass
        for (int i = 0; i < layers.size(); i++){
            const Specification::NeuralNetworkLayer& layer = layers[i];
            PassColorsDown(layer);
            ProcessLayer(layer);
        } // loop over layers

#if COREML_VALIDATOR_VERBOSE
        std::cout << std::endl << std::endl << "Starting backward computation of neural network shapes" << std::endl << std::endl;
#endif

        // backward pass
        for (int i = layers.size() - 1; i >= 0; i--){
            const Specification::NeuralNetworkLayer& layer = layers[i];
            PassColorsUp(layer);
            ProcessLayer(layer);
        } // loop over layers

        done = AllShapesDone();

        if (blobColorsCopy == blobColors) {
            break;
        }
    }

    if (useInputAndOutputConstraints) {
        for (int i = 0; i < interface.output().size(); i++) {
            const Specification::FeatureDescription& desc = interface.output(i);

            // skip over names that are just for the classifier
            if (desc.name().compare(interface.predictedprobabilitiesname()) == 0
                || desc.name().compare(interface.predictedfeaturename()) == 0) {
                continue;
            }
            
            // using at because it needs to exist, this will throw if it doesn't
            if (blobShapes.find(desc.name()) == blobShapes.end()) {
                continue;
            }
            ShapeConstraint& constraint = blobShapes.at(desc.name());

            // TODO: add a catch with an error message that mentions the name

            if (desc.type().Type_case() == Specification::FeatureType::kImageType) {
                // sequence constraint here is unbounded
                // batch is unbounded
                // other three read from the constraint as is -- later to be updated with flexibility
                if (desc.type().imagetype().colorspace() == Specification::ImageFeatureType_ColorSpace_GRAYSCALE)
                    constraint.setChannel(1);
                else {
                    constraint.setChannel(3);
                }
                constraint.setHeight(static_cast<size_t>(desc.type().imagetype().height()));
                constraint.setWidth(static_cast<size_t>(desc.type().imagetype().width()));
            }
            else { // assuming it's a multi array

                // allowing for the possibility that output shapes aren't constrained
                if (desc.type().multiarraytype().shape_size() == 3) {
                    constraint.setChannel(static_cast<size_t>(desc.type().multiarraytype().shape(0)));
                    constraint.setHeight(static_cast<size_t>(desc.type().multiarraytype().shape(1)));
                    constraint.setWidth(static_cast<size_t>(desc.type().multiarraytype().shape(2)));
                }
                else if (desc.type().multiarraytype().shape_size() == 1) {
                    constraint.setChannel(static_cast<size_t>(desc.type().multiarraytype().shape(0)));
                    constraint.setHeight(1);
                    constraint.setWidth(1);
                }
            }
        }
    }

}